

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

Float pbrt::InnerProduct(SpectrumHandle *a,SpectrumHandle *b)

{
  undefined1 auVar1 [16];
  SpectrumHandle *in_RSI;
  undefined8 in_RDI;
  Float FVar2;
  undefined1 auVar3 [64];
  Float lambda;
  Float result;
  Float lambda_00;
  undefined4 local_18;
  undefined4 local_14;
  undefined1 extraout_var [60];
  
  local_14 = 0.0;
  for (local_18 = 360.0; local_18 <= 830.0; local_18 = local_18 + 1.0) {
    lambda_00 = (Float)((ulong)in_RDI >> 0x20);
    FVar2 = SpectrumHandle::operator()(in_RSI,lambda_00);
    auVar3._0_4_ = SpectrumHandle::operator()(in_RSI,lambda_00);
    auVar3._4_60_ = extraout_var;
    auVar1 = vfmadd213ss_fma(auVar3._0_16_,ZEXT416((uint)FVar2),ZEXT416((uint)local_14));
    local_14 = auVar1._0_4_;
  }
  return local_14 / 106.856895;
}

Assistant:

inline Float InnerProduct(SpectrumHandle a, SpectrumHandle b) {
    Float result = 0;
    for (Float lambda = Lambda_min; lambda <= Lambda_max; ++lambda)
        result += a(lambda) * b(lambda);
    return result / CIE_Y_integral;
}